

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowDebugLogWindow(bool *p_open)

{
  ImVec2 IVar1;
  bool bVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  float fVar5;
  float fVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  ImGuiID target_id;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  ImVec2 p1;
  ImVec2 p0;
  ImGuiID id;
  char *p;
  ImRect text_rect;
  char *line_end;
  char *line_begin;
  int line_no;
  ImGuiListClipper clipper;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000274;
  bool *in_stack_00000278;
  char *in_stack_00000280;
  ImVec2 *in_stack_fffffffffffffe78;
  ImGuiWindowFlags in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  undefined1 in_stack_fffffffffffffe88 [16];
  float center_y_ratio;
  float in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  ImGuiTextIndex *in_stack_fffffffffffffea0;
  char *text;
  undefined1 in_stack_fffffffffffffea8 [16];
  ImVec2 *in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImRect local_a4;
  ImVec2 local_94;
  ImVec2 local_8c;
  undefined4 local_84;
  char *local_80;
  ImVec2 local_78;
  ImVec2 IStack_70;
  char *local_60;
  char *local_58;
  int local_50;
  int local_40;
  int local_3c;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiContext *local_10;
  
  local_10 = GImGui;
  if (((GImGui->NextWindowData).Flags & 2U) == 0) {
    fVar5 = GetFontSize();
    ImVec2::ImVec2(&local_18,0.0,fVar5 * 12.0);
    SetNextWindowSize(&local_18,4);
  }
  bVar2 = Begin(in_stack_00000280,in_stack_00000278,in_stack_00000274);
  if ((bVar2) && (pIVar4 = GetCurrentWindow(), pIVar4->BeginCount < 2)) {
    AlignTextToFramePadding();
    Text("Log events:");
    SameLine(0.0,-1.0);
    CheckboxFlags((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (int *)in_stack_fffffffffffffe78,0);
    SameLine(0.0,-1.0);
    CheckboxFlags((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (int *)in_stack_fffffffffffffe78,0);
    SameLine(0.0,-1.0);
    CheckboxFlags((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (int *)in_stack_fffffffffffffe78,0);
    SameLine(0.0,-1.0);
    CheckboxFlags((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (int *)in_stack_fffffffffffffe78,0);
    SameLine(0.0,-1.0);
    CheckboxFlags((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (int *)in_stack_fffffffffffffe78,0);
    SameLine(0.0,-1.0);
    CheckboxFlags((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (int *)in_stack_fffffffffffffe78,0);
    SameLine(0.0,-1.0);
    CheckboxFlags((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (int *)in_stack_fffffffffffffe78,0);
    bVar2 = SmallButton(in_stack_fffffffffffffe88._8_8_);
    if (bVar2) {
      ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x4b782a);
      ImGuiTextIndex::clear
                ((ImGuiTextIndex *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
    SameLine(0.0,-1.0);
    bVar2 = SmallButton(in_stack_fffffffffffffe88._8_8_);
    if (bVar2) {
      ImGuiTextBuffer::c_str(&local_10->DebugLogBuf);
      SetClipboardText((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
    ImVec2::ImVec2(&local_20,0.0,0.0);
    BeginChild(in_stack_fffffffffffffe88._8_8_,in_stack_fffffffffffffe88._0_8_,
               SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0),in_stack_fffffffffffffe80);
    ImGuiListClipper::ImGuiListClipper
              ((ImGuiListClipper *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    ImGuiTextIndex::size(&local_10->DebugLogIndex);
    ImGuiListClipper::Begin
              ((ImGuiListClipper *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
    while (bVar2 = ImGuiListClipper::Step(in_stack_fffffffffffffe88._8_8_), bVar2) {
      for (local_50 = local_40; local_50 < local_3c; local_50 = local_50 + 1) {
        ImGuiTextBuffer::c_str(&local_10->DebugLogBuf);
        local_58 = ImGuiTextIndex::get_line_begin
                             (in_stack_fffffffffffffe88._8_8_,in_stack_fffffffffffffe88._0_8_,
                              in_stack_fffffffffffffe84);
        ImGuiTextBuffer::c_str(&local_10->DebugLogBuf);
        local_60 = ImGuiTextIndex::get_line_end
                             (in_stack_fffffffffffffea0,
                              (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                              in_stack_fffffffffffffe88._12_4_);
        TextUnformatted((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                        (char *)in_stack_fffffffffffffe78);
        local_78 = (local_10->LastItemData).Rect.Min;
        IStack_70 = (local_10->LastItemData).Rect.Max;
        bVar2 = IsItemHovered(in_stack_fffffffffffffe88._8_4_);
        if (bVar2) {
          for (local_80 = local_58; local_80 < local_60 + -10; local_80 = local_80 + 1) {
            local_84 = 0;
            if ((*local_80 == '0') && ((local_80[1] == 'x' || (local_80[1] == 'X')))) {
              iVar3 = __isoc99_sscanf(local_80 + 2,"%X",&local_84);
              text = in_stack_fffffffffffffea8._0_8_;
              if (iVar3 == 1) {
                local_8c = CalcTextSize(text,(char *)in_stack_fffffffffffffea0,
                                        SUB41((uint)in_stack_fffffffffffffe9c >> 0x18,0),
                                        in_stack_fffffffffffffe98);
                local_94 = CalcTextSize(text,(char *)in_stack_fffffffffffffea0,
                                        SUB41((uint)in_stack_fffffffffffffe9c >> 0x18,0),
                                        in_stack_fffffffffffffe98);
                ImVec2::ImVec2(&local_b4,local_8c.x,0.0);
                local_ac = ::operator+(in_stack_fffffffffffffe78,(ImVec2 *)0x4b7bb6);
                in_stack_fffffffffffffea8._8_4_ = extraout_XMM0_Dc;
                in_stack_fffffffffffffea8._0_4_ = local_ac.x;
                in_stack_fffffffffffffea8._4_4_ = local_ac.y;
                in_stack_fffffffffffffea8._12_4_ = extraout_XMM0_Dd;
                in_stack_fffffffffffffea0 = (ImGuiTextIndex *)&local_78;
                ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff3c,local_8c.x + local_94.x,local_94.y
                              );
                IVar1 = ::operator+(in_stack_fffffffffffffe78,(ImVec2 *)0x4b7c18);
                in_stack_fffffffffffffe88._8_4_ = extraout_XMM0_Dc_00;
                in_stack_fffffffffffffe88._0_4_ = IVar1.x;
                in_stack_fffffffffffffe88._4_4_ = IVar1.y;
                in_stack_fffffffffffffe88._12_4_ = extraout_XMM0_Dd_00;
                ImRect::ImRect(&local_a4,&local_ac,(ImVec2 *)&stack0xffffffffffffff44);
                (local_10->LastItemData).Rect.Min = local_a4.Min;
                (local_10->LastItemData).Rect.Max = local_a4.Max;
                bVar2 = IsMouseHoveringRect(in_stack_fffffffffffffeb8,
                                            in_stack_fffffffffffffea8._8_8_,
                                            in_stack_fffffffffffffea8[7]);
                in_stack_fffffffffffffe84 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe84);
                if (bVar2) {
                  DebugLocateItemOnHover(target_id);
                }
                local_80 = local_80 + 10;
              }
            }
          }
        }
      }
    }
    fVar5 = GetScrollY();
    center_y_ratio = in_stack_fffffffffffffe88._12_4_;
    fVar6 = GetScrollMaxY();
    if (fVar6 <= fVar5) {
      SetScrollHereY(center_y_ratio);
    }
    EndChild();
    End();
    ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)0x4b7d3c);
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowDebugLogWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 12.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Debug Log", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    AlignTextToFramePadding();
    Text("Log events:");
    SameLine(); CheckboxFlags("All", &g.DebugLogFlags, ImGuiDebugLogFlags_EventMask_);
    SameLine(); CheckboxFlags("ActiveId", &g.DebugLogFlags, ImGuiDebugLogFlags_EventActiveId);
    SameLine(); CheckboxFlags("Focus", &g.DebugLogFlags, ImGuiDebugLogFlags_EventFocus);
    SameLine(); CheckboxFlags("Popup", &g.DebugLogFlags, ImGuiDebugLogFlags_EventPopup);
    SameLine(); CheckboxFlags("Nav", &g.DebugLogFlags, ImGuiDebugLogFlags_EventNav);
    SameLine(); CheckboxFlags("Clipper", &g.DebugLogFlags, ImGuiDebugLogFlags_EventClipper);
    SameLine(); CheckboxFlags("IO", &g.DebugLogFlags, ImGuiDebugLogFlags_EventIO);

    if (SmallButton("Clear"))
    {
        g.DebugLogBuf.clear();
        g.DebugLogIndex.clear();
    }
    SameLine();
    if (SmallButton("Copy"))
        SetClipboardText(g.DebugLogBuf.c_str());
    BeginChild("##log", ImVec2(0.0f, 0.0f), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar);

    ImGuiListClipper clipper;
    clipper.Begin(g.DebugLogIndex.size());
    while (clipper.Step())
        for (int line_no = clipper.DisplayStart; line_no < clipper.DisplayEnd; line_no++)
        {
            const char* line_begin = g.DebugLogIndex.get_line_begin(g.DebugLogBuf.c_str(), line_no);
            const char* line_end = g.DebugLogIndex.get_line_end(g.DebugLogBuf.c_str(), line_no);
            TextUnformatted(line_begin, line_end);
            ImRect text_rect = g.LastItemData.Rect;
            if (IsItemHovered())
                for (const char* p = line_begin; p < line_end - 10; p++)
                {
                    ImGuiID id = 0;
                    if (p[0] != '0' || (p[1] != 'x' && p[1] != 'X') || sscanf(p + 2, "%X", &id) != 1)
                        continue;
                    ImVec2 p0 = CalcTextSize(line_begin, p);
                    ImVec2 p1 = CalcTextSize(p, p + 10);
                    g.LastItemData.Rect = ImRect(text_rect.Min + ImVec2(p0.x, 0.0f), text_rect.Min + ImVec2(p0.x + p1.x, p1.y));
                    if (IsMouseHoveringRect(g.LastItemData.Rect.Min, g.LastItemData.Rect.Max, true))
                        DebugLocateItemOnHover(id);
                    p += 10;
                }
        }
    if (GetScrollY() >= GetScrollMaxY())
        SetScrollHereY(1.0f);
    EndChild();

    End();
}